

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O1

int64_t file_size(char *path)

{
  int iVar1;
  int64_t iVar2;
  stat sb;
  stat local_90;
  
  iVar1 = stat(path,&local_90);
  iVar2 = -1;
  if (-1 < iVar1) {
    iVar2 = local_90.st_size;
  }
  return iVar2;
}

Assistant:

int64_t file_size (const char *path) {
    #ifdef WIN32
    WIN32_FILE_ATTRIBUTE_DATA fileInfo;
    if (GetFileAttributesExA(path, GetFileExInfoStandard, (void*)&fileInfo) == 0) return -1;
    return (int64_t)(((__int64)fileInfo.nFileSizeHigh) << 32 ) + fileInfo.nFileSizeLow;
    #else
    struct stat sb;
    if (stat(path, &sb) < 0) return -1;
    return (int64_t)sb.st_size;
    #endif
}